

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error processInternalEntity(XML_Parser parser,ENTITY *entity,XML_Bool betweenDecl)

{
  XML_Error XVar1;
  OPEN_INTERNAL_ENTITY *local_50;
  OPEN_INTERNAL_ENTITY *openEntity;
  char *pcStack_40;
  XML_Error result;
  char *next;
  char *textEnd;
  char *textStart;
  ENTITY *pEStack_20;
  XML_Bool betweenDecl_local;
  ENTITY *entity_local;
  XML_Parser parser_local;
  
  textStart._7_1_ = betweenDecl;
  pEStack_20 = entity;
  entity_local = (ENTITY *)parser;
  if (parser->m_freeInternalEntities == (OPEN_INTERNAL_ENTITY *)0x0) {
    local_50 = (OPEN_INTERNAL_ENTITY *)(*(parser->m_mem).malloc_fcn)(0x28);
    if (local_50 == (OPEN_INTERNAL_ENTITY *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
  }
  else {
    local_50 = parser->m_freeInternalEntities;
    parser->m_freeInternalEntities = local_50->next;
  }
  pEStack_20->open = '\x01';
  pEStack_20->processed = 0;
  local_50->next = (open_internal_entity *)entity_local[8].base;
  entity_local[8].base = (XML_Char *)local_50;
  local_50->entity = pEStack_20;
  local_50->startTagLevel = *(int *)((long)&entity_local[8].notation + 4);
  local_50->betweenDecl = textStart._7_1_;
  local_50->internalEventPtr = (char *)0x0;
  local_50->internalEventEndPtr = (char *)0x0;
  pcStack_40 = pEStack_20->textPtr;
  next = pEStack_20->textPtr + pEStack_20->textLen;
  textEnd = pcStack_40;
  XVar1 = doContent((XML_Parser)entity_local,*(int *)((long)&entity_local[8].notation + 4),
                    (ENCODING *)entity_local[6].notation,pcStack_40,next,&stack0xffffffffffffffc0,
                    '\0',XML_ACCOUNT_ENTITY_EXPANSION);
  if (XVar1 == XML_ERROR_NONE) {
    if ((next == pcStack_40) || (*(int *)&entity_local[0xd].notation != 3)) {
      pEStack_20->open = '\0';
      entity_local[8].base = (XML_Char *)local_50->next;
      local_50->next = (open_internal_entity *)entity_local[8].publicId;
      entity_local[8].publicId = (XML_Char *)local_50;
    }
    else {
      pEStack_20->processed = (int)pcStack_40 - (int)textEnd;
      *(code **)&entity_local[7].open = internalEntityProcessor;
    }
  }
  return XVar1;
}

Assistant:

static enum XML_Error
processInternalEntity(XML_Parser parser, ENTITY *entity, XML_Bool betweenDecl) {
  const char *textStart, *textEnd;
  const char *next;
  enum XML_Error result;
  OPEN_INTERNAL_ENTITY *openEntity;

  if (parser->m_freeInternalEntities) {
    openEntity = parser->m_freeInternalEntities;
    parser->m_freeInternalEntities = openEntity->next;
  } else {
    openEntity
        = (OPEN_INTERNAL_ENTITY *)MALLOC(parser, sizeof(OPEN_INTERNAL_ENTITY));
    if (! openEntity)
      return XML_ERROR_NO_MEMORY;
  }
  entity->open = XML_TRUE;
#ifdef XML_DTD
  entityTrackingOnOpen(parser, entity, __LINE__);
#endif
  entity->processed = 0;
  openEntity->next = parser->m_openInternalEntities;
  parser->m_openInternalEntities = openEntity;
  openEntity->entity = entity;
  openEntity->startTagLevel = parser->m_tagLevel;
  openEntity->betweenDecl = betweenDecl;
  openEntity->internalEventPtr = NULL;
  openEntity->internalEventEndPtr = NULL;
  textStart = (const char *)entity->textPtr;
  textEnd = (const char *)(entity->textPtr + entity->textLen);
  /* Set a safe default value in case 'next' does not get set */
  next = textStart;

#ifdef XML_DTD
  if (entity->is_param) {
    int tok
        = XmlPrologTok(parser->m_internalEncoding, textStart, textEnd, &next);
    result = doProlog(parser, parser->m_internalEncoding, textStart, textEnd,
                      tok, next, &next, XML_FALSE, XML_FALSE,
                      XML_ACCOUNT_ENTITY_EXPANSION);
  } else
#endif /* XML_DTD */
    result = doContent(parser, parser->m_tagLevel, parser->m_internalEncoding,
                       textStart, textEnd, &next, XML_FALSE,
                       XML_ACCOUNT_ENTITY_EXPANSION);

  if (result == XML_ERROR_NONE) {
    if (textEnd != next && parser->m_parsingStatus.parsing == XML_SUSPENDED) {
      entity->processed = (int)(next - textStart);
      parser->m_processor = internalEntityProcessor;
    } else {
#ifdef XML_DTD
      entityTrackingOnClose(parser, entity, __LINE__);
#endif /* XML_DTD */
      entity->open = XML_FALSE;
      parser->m_openInternalEntities = openEntity->next;
      /* put openEntity back in list of free instances */
      openEntity->next = parser->m_freeInternalEntities;
      parser->m_freeInternalEntities = openEntity;
    }
  }
  return result;
}